

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O1

void __thiscall
xatlas::internal::
HashMap<xatlas::internal::Mesh::EdgeKey,_xatlas::internal::Mesh::EdgeHash,_xatlas::internal::Equal<xatlas::internal::Mesh::EdgeKey>_>
::add(HashMap<xatlas::internal::Mesh::EdgeKey,_xatlas::internal::Mesh::EdgeHash,_xatlas::internal::Equal<xatlas::internal::Mesh::EdgeKey>_>
      *this,EdgeKey *key)

{
  ulong uVar1;
  
  if (this->m_slots == (uint32_t *)0x0) {
    alloc(this);
  }
  uVar1 = (ulong)(key->v0 * 0x8000 + key->v1) % (ulong)this->m_numSlots;
  ArrayBase::push_back(&(this->m_keys).m_base,(uint8_t *)key);
  ArrayBase::push_back(&(this->m_next).m_base,(uint8_t *)(this->m_slots + uVar1));
  this->m_slots[uVar1] = (this->m_next).m_base.size - 1;
  return;
}

Assistant:

void add(const Key &key)
	{
		if (!m_slots)
			alloc();
		const uint32_t hash = computeHash(key);
		m_keys.push_back(key);
		m_next.push_back(m_slots[hash]);
		m_slots[hash] = m_next.size() - 1;
	}